

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TargetImageWidget.cpp
# Opt level: O0

void __thiscall TargetImageWidget::onSaveImageRequested(TargetImageWidget *this)

{
  undefined1 local_a0 [32];
  QString local_80;
  QString local_58;
  QString local_40;
  undefined1 local_28 [8];
  QString fileName;
  TargetImageWidget *this_local;
  
  fileName.d.size = (qsizetype)this;
  QString::QString(&local_40,"Select Image");
  QString::QString(&local_58,"");
  QString::QString(&local_80,"Images (*.png *.xpm *.jpg)");
  QFlags<QFileDialog::Option>::QFlags((QFlags<QFileDialog::Option> *)(local_a0 + 0x1c));
  QFileDialog::getSaveFileName
            ((QWidget *)local_28,(QString *)this,&local_40,&local_58,&local_80,
             (QFlags_conflict1 *)0x0);
  QString::~QString(&local_80);
  QString::~QString(&local_58);
  QString::~QString(&local_40);
  GetImageInViewTargetArea((TargetImageWidget *)local_a0);
  QImage::save((QString *)local_a0,local_28,0);
  QImage::~QImage((QImage *)local_a0);
  QString::~QString((QString *)local_28);
  return;
}

Assistant:

void TargetImageWidget::onSaveImageRequested()
{
    QString fileName = QFileDialog::getSaveFileName(this, "Select Image", "", "Images (*.png *.xpm *.jpg)");
    GetImageInViewTargetArea().save(fileName);
}